

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetailedHelloWorld.cpp
# Opt level: O2

int main(void)

{
  atomic<unsigned_long> eventSourceId;
  cx_string<2UL> cVar1;
  __atomic_base<unsigned_long> _Var2;
  nanoseconds clock;
  bool bVar3;
  allocator local_3fc;
  allocator local_3fb;
  allocator local_3fa;
  allocator local_3f9;
  string local_3f8;
  SessionWriter writer;
  ConsumeResult local_3a8;
  undefined1 local_388 [48];
  string local_358 [32];
  string local_338 [32];
  uint64_t local_318;
  string local_310 [32];
  string local_2f0 [32];
  Session session;
  ofstream logfile;
  char cStack_226;
  undefined5 uStack_225;
  byte abStack_208 [480];
  
  binlog::Session::Session(&session);
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  local_3f8._M_string_length = 0;
  local_3f8.field_2._M_local_buf[0] = '\0';
  binlog::SessionWriter::SessionWriter(&writer,&session,0x100000,0,&local_3f8);
  std::__cxx11::string::~string((string *)&local_3f8);
  if (((writer._session)->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      local_388._0_8_ = 0;
      local_388._8_2_ = info;
      std::__cxx11::string::string((string *)(local_388 + 0x10),"main",(allocator *)&local_3a8);
      std::__cxx11::string::string(local_358,"main",&local_3f9);
      std::__cxx11::string::string
                (local_338,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/example/DetailedHelloWorld.cpp"
                 ,&local_3fa);
      local_318 = 0xd;
      std::__cxx11::string::string(local_310,"Hello {}!",&local_3fb);
      cVar1 = binlog::detail::concatenated_tags<char_const(&)[10],char_const(&)[6]>
                        ((char (*) [10])"Hello {}!",(char (*) [6])"World");
      _logfile = cVar1._data._0_2_;
      cStack_226 = cVar1._data[2];
      std::__cxx11::string::string(local_2f0,(char *)&logfile,&local_3fc);
      _Var2._M_i = binlog::Session::addEventSource(writer._session,(EventSource *)local_388);
      binlog::EventSource::~EventSource((EventSource *)local_388);
      LOCK();
      UNLOCK();
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    }
    eventSourceId.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    clock = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<char_const(&)[6]>
              (&writer,(uint64_t)eventSourceId.super___atomic_base<unsigned_long>._M_i,clock.__r,
               (char (*) [6])"World");
  }
  std::ofstream::ofstream(&logfile,"hello.blog",_S_out|_S_bin);
  binlog::Session::consume<std::ofstream>(&local_3a8,&session,&logfile);
  bVar3 = (abStack_208[*(long *)(CONCAT53(uStack_225,CONCAT12(cStack_226,_logfile)) + -0x18)] & 5)
          == 0;
  if (bVar3) {
    std::operator<<((ostream *)&std::cout,"Binary log written to hello.blog\n");
  }
  else {
    std::operator<<((ostream *)&std::cerr,"Failed to write hello.blog\n");
  }
  std::ofstream::~ofstream(&logfile);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&writer._channel.
              super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  binlog::Session::~Session(&session);
  return (uint)!bVar3;
}

Assistant:

int main()
{
  binlog::Session session;
  binlog::SessionWriter writer(session);

  BINLOG_INFO_W(writer, "Hello {}!", "World");

  std::ofstream logfile("hello.blog", std::ofstream::out|std::ofstream::binary);
  session.consume(logfile);

  if (! logfile)
  {
    std::cerr << "Failed to write hello.blog\n";
    return 1;
  }

  std::cout << "Binary log written to hello.blog\n";
  return 0;
}